

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O0

Aig_Man_t * Saig_ManCreateEquivMiter(Aig_Man_t *pAig,Vec_Int_t *vPairs,int fAddOuts)

{
  Vec_Ptr_t *p;
  int iVar1;
  char *pcVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  Aig_Obj_t *pAVar6;
  int local_4c;
  int i;
  Aig_Obj_t *pMiter;
  Aig_Obj_t *pObj2;
  Aig_Obj_t *pObj;
  Aig_Man_t *pAigNew;
  int fAddOuts_local;
  Vec_Int_t *vPairs_local;
  Aig_Man_t *pAig_local;
  
  if (pAig->nConstrs < 1) {
    iVar1 = Aig_ManNodeNum(pAig);
    pAig_local = Aig_ManStart(iVar1);
    pcVar2 = Abc_UtilStrsav(pAig->pName);
    pAig_local->pName = pcVar2;
    pAig_local->nConstrs = pAig->nConstrs;
    pAVar3 = Aig_ManConst1(pAig_local);
    pAVar4 = Aig_ManConst1(pAig);
    (pAVar4->field_5).pData = pAVar3;
    for (local_4c = 0; iVar1 = Vec_PtrSize(pAig->vCis), local_4c < iVar1; local_4c = local_4c + 1) {
      pvVar5 = Vec_PtrEntry(pAig->vCis,local_4c);
      pAVar3 = Aig_ObjCreateCi(pAig_local);
      *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar3;
    }
    for (local_4c = 0; iVar1 = Vec_PtrSize(pAig->vObjs), local_4c < iVar1; local_4c = local_4c + 1)
    {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_4c);
      if ((pAVar3 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar3), iVar1 != 0)) {
        pAVar4 = Aig_ObjChild0Copy(pAVar3);
        pAVar6 = Aig_ObjChild1Copy(pAVar3);
        pAVar4 = Aig_And(pAig_local,pAVar4,pAVar6);
        (pAVar3->field_5).pData = pAVar4;
      }
    }
    iVar1 = Vec_IntSize(vPairs);
    if (iVar1 % 2 != 0) {
      __assert_fail("Vec_IntSize(vPairs) % 2 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigDup.c"
                    ,0x72,"Aig_Man_t *Saig_ManCreateEquivMiter(Aig_Man_t *, Vec_Int_t *, int)");
    }
    for (local_4c = 0; iVar1 = Vec_IntSize(vPairs), local_4c < iVar1; local_4c = local_4c + 2) {
      iVar1 = Vec_IntEntry(vPairs,local_4c);
      pAVar3 = Aig_ManObj(pAig,iVar1);
      iVar1 = Vec_IntEntry(vPairs,local_4c + 1);
      pAVar4 = Aig_ManObj(pAig,iVar1);
      pAVar6 = Aig_Exor(pAig_local,(Aig_Obj_t *)(pAVar3->field_5).pData,
                        (Aig_Obj_t *)(pAVar4->field_5).pData);
      pAVar3 = Aig_NotCond(pAVar6,(uint)(*(ulong *)&pAVar3->field_0x18 >> 3) & 1 ^
                                  (uint)(*(ulong *)&pAVar4->field_0x18 >> 3) & 1);
      Aig_ObjCreateCo(pAig_local,pAVar3);
    }
    if (fAddOuts != 0) {
      for (local_4c = 0; iVar1 = Saig_ManRegNum(pAig), local_4c < iVar1; local_4c = local_4c + 1) {
        p = pAig->vCos;
        iVar1 = Saig_ManPoNum(pAig);
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p,local_4c + iVar1);
        pAVar3 = Aig_ObjChild0Copy(pAVar3);
        Aig_ObjCreateCo(pAig_local,pAVar3);
      }
    }
    Aig_ManCleanup(pAig_local);
    if (fAddOuts != 0) {
      iVar1 = Aig_ManRegNum(pAig);
      Aig_ManSetRegNum(pAig_local,iVar1);
    }
  }
  else {
    printf("The AIG manager should have no constraints.\n");
    pAig_local = (Aig_Man_t *)0x0;
  }
  return pAig_local;
}

Assistant:

Aig_Man_t * Saig_ManCreateEquivMiter( Aig_Man_t * pAig, Vec_Int_t * vPairs, int fAddOuts )
{
    Aig_Man_t * pAigNew;
    Aig_Obj_t * pObj, * pObj2, * pMiter;
    int i;
    if ( pAig->nConstrs > 0 )
    {
        printf( "The AIG manager should have no constraints.\n" );
        return NULL;
    }
    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    pAigNew->nConstrs = pAig->nConstrs;
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // add internal nodes of this frame
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create POs
    assert( Vec_IntSize(vPairs) % 2 == 0 );
    Aig_ManForEachObjVec( vPairs, pAig, pObj, i )
    {
        pObj2  = Aig_ManObj( pAig, Vec_IntEntry(vPairs, ++i) );
        pMiter = Aig_Exor( pAigNew, (Aig_Obj_t *)pObj->pData, (Aig_Obj_t *)pObj2->pData );
        pMiter = Aig_NotCond( pMiter, pObj->fPhase ^ pObj2->fPhase );
        Aig_ObjCreateCo( pAigNew, pMiter );
    }
    // transfer to register outputs
    if ( fAddOuts )
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManCleanup( pAigNew );
    if ( fAddOuts )
    Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig) );
    return pAigNew;
}